

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matchNextToken(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               *this)

{
  int iVar1;
  bool bVar2;
  UnicodeChar UVar3;
  UTF8Reader *this_00;
  char *pcVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool local_289;
  bool local_231;
  allocator<char> local_1f9;
  UTF8Reader local_1f8;
  string local_1f0 [32];
  CompileMessage local_1d0;
  CompileMessage local_198;
  UTF8Reader local_160;
  allocator<char> local_151;
  string local_150 [32];
  CompileMessage local_130;
  UTF8Reader local_f8;
  UTF8Reader local_f0;
  UTF8Reader end_2;
  string local_e0 [32];
  UTF8Reader local_c0;
  UTF8Reader end_1;
  UnicodeChar c2;
  UnicodeChar local_a0;
  allocator<char> local_99;
  UnicodeChar currentChar;
  UTF8Reader local_78 [3];
  CompileMessage local_60;
  int local_24;
  int len;
  UTF8Reader end;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  TokenType keyword;
  
  end.data = (char *)this;
  UVar3 = UTF8Reader::operator*(&this->input);
  bVar2 = IdentifierMatcher::isIdentifierStart(UVar3);
  if (bVar2) {
    UTF8Reader::UTF8Reader((UTF8Reader *)&stack0xffffffffffffffe0,&this->input);
    local_24 = 1;
    while( true ) {
      this_00 = UTF8Reader::operator++((UTF8Reader *)&stack0xffffffffffffffe0);
      UVar3 = UTF8Reader::operator*(this_00);
      bVar2 = IdentifierMatcher::isIdentifierBody(UVar3);
      iVar1 = local_24;
      if (!bVar2) break;
      local_24 = local_24 + 1;
      if (0x100 < local_24) {
        Errors::identifierTooLong<>();
        (*this->_vptr_Tokeniser[2])(this,&local_60);
        CompileMessage::~CompileMessage(&local_60);
      }
    }
    UTF8Reader::UTF8Reader(local_78,&this->input);
    this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  *)DummyKeywordMatcher::match(iVar1,local_78);
    bVar2 = TokenType::operator_cast_to_bool((TokenType *)&this_local);
    if (bVar2) {
      UTF8Reader::operator+=(&this->input,local_24);
    }
    else {
      pcVar4 = UTF8Reader::getAddress(&this->input);
      pcVar5 = UTF8Reader::getAddress((UTF8Reader *)&stack0xffffffffffffffe0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&currentChar,pcVar4,pcVar5,&local_99)
      ;
      std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&currentChar);
      std::__cxx11::string::~string((string *)&currentChar);
      std::allocator<char>::~allocator(&local_99);
      UTF8Reader::operator=(&this->input,(UTF8Reader *)&stack0xffffffffffffffe0);
      this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    *)IdentifierMatcher::categoriseIdentifier(&this->currentStringValue);
    }
  }
  else {
    bVar2 = UTF8Reader::isDigit(&this->input);
    if (bVar2) {
      this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    *)parseNumericLiteral(this,false);
    }
    else {
      local_a0 = UTF8Reader::operator*(&this->input);
      local_231 = false;
      iVar1 = (int)this;
      if (local_a0 == 0x2d) {
        UTF8Reader::operator+((UTF8Reader *)&stack0xffffffffffffff58,iVar1 + 0x68);
        local_231 = UTF8Reader::isDigit((UTF8Reader *)&stack0xffffffffffffff58);
      }
      if (local_231 == false) {
        bVar2 = parseStringLiteral(this,local_a0);
        if (bVar2) {
          this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        *)anon_var_dwarf_d468b;
        }
        else if ((local_a0 == 0x2e) && (bVar2 = parseFloatLiteral(this), bVar2)) {
          this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        *)(this->literalType).text;
        }
        else {
          if ((local_a0 == 0x2f) && ((this->shouldIgnoreComments & 1U) == 0)) {
            UTF8Reader::operator+(&end_1,iVar1 + 0x68);
            UVar3 = UTF8Reader::operator*(&end_1);
            if (UVar3 == 0x2f) {
              UTF8Reader::find(&local_c0,(char *)&this->input);
              pcVar4 = UTF8Reader::getAddress(&this->input);
              pcVar5 = UTF8Reader::getAddress(&local_c0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<char_const*,void>
                        (local_e0,pcVar4,pcVar5,(allocator<char> *)((long)&end_2.data + 7));
              std::__cxx11::string::operator=((string *)&this->currentStringValue,local_e0);
              std::__cxx11::string::~string(local_e0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&end_2.data + 7));
              UTF8Reader::operator=(&this->input,&local_c0);
              this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            *)anon_var_dwarf_d472e;
              return (TokenType)(char *)this_local;
            }
            if (UVar3 == 0x2a) {
              UTF8Reader::operator=(&(this->location).location,&this->input);
              UTF8Reader::operator+(&local_f8,iVar1 + 0x68);
              UTF8Reader::find(&local_f0,(char *)&local_f8);
              bVar2 = UTF8Reader::isEmpty(&local_f0);
              if (bVar2) {
                Errors::unterminatedComment<>();
                (*this->_vptr_Tokeniser[2])(this,&local_130);
                CompileMessage::~CompileMessage(&local_130);
              }
              UTF8Reader::operator+=(&local_f0,2);
              pcVar4 = UTF8Reader::getAddress(&this->input);
              pcVar5 = UTF8Reader::getAddress(&local_f0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<char_const*,void>(local_150,pcVar4,pcVar5,&local_151);
              std::__cxx11::string::operator=((string *)&this->currentStringValue,local_150);
              std::__cxx11::string::~string(local_150);
              std::allocator<char>::~allocator(&local_151);
              UTF8Reader::operator=(&this->input,&local_f0);
              this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            *)anon_var_dwarf_d472e;
              return (TokenType)(char *)this_local;
            }
          }
          this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        *)HEARTOperator::Matcher::match(&this->input);
          bVar2 = TokenType::operator_cast_to_bool((TokenType *)&this_local);
          if (!bVar2) {
            local_289 = false;
            if (local_a0 == 0x5f) {
              UTF8Reader::operator+(&local_160,iVar1 + 0x68);
              UVar3 = UTF8Reader::operator*(&local_160);
              local_289 = IdentifierMatcher::isIdentifierBody(UVar3);
            }
            if (local_289 != false) {
              Errors::noLeadingUnderscoreAllowed<>();
              (*this->_vptr_Tokeniser[2])(this,&local_198);
              CompileMessage::~CompileMessage(&local_198);
            }
            bVar2 = UTF8Reader::isEmpty(&this->input);
            if (!bVar2) {
              pcVar4 = UTF8Reader::getAddress(&this->input);
              UTF8Reader::operator+(&local_1f8,(int)&this->input);
              pcVar5 = UTF8Reader::getAddress(&local_1f8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<char_const*,void>(local_1f0,pcVar4,pcVar5,&local_1f9);
              Errors::illegalCharacter<std::__cxx11::string>(&local_1d0,(Errors *)local_1f0,args);
              (*this->_vptr_Tokeniser[2])(this,&local_1d0);
              CompileMessage::~CompileMessage(&local_1d0);
              std::__cxx11::string::~string(local_1f0);
              std::allocator<char>::~allocator(&local_1f9);
            }
            this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          *)anon_var_dwarf_dda05;
          }
        }
      }
      else {
        UTF8Reader::operator++(&this->input);
        this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      *)parseNumericLiteral(this,true);
        bVar2 = TokenType::operator==((TokenType *)&this_local,(TokenType *)&Token::literalInt32);
        if ((bVar2) ||
           (bVar2 = TokenType::operator==
                              ((TokenType *)&this_local,(TokenType *)&Token::literalInt64), bVar2))
        {
          this->literalIntValue = -this->literalIntValue;
        }
        else {
          this->literalDoubleValue = -this->literalDoubleValue;
        }
      }
    }
  }
  return (TokenType)(char *)this_local;
}

Assistant:

TokenType matchNextToken()
    {
        if (IdentifierMatcher::isIdentifierStart (*input))
        {
            auto end = input;
            int len = 1;

            while (IdentifierMatcher::isIdentifierBody (*++end))
                if (++len > (int) maxIdentifierLength)
                    throwError (Errors::identifierTooLong());

            if (auto keyword = KeywordList::match (len, input))
            {
                input += len;
                return keyword;
            }

            currentStringValue = std::string (input.getAddress(), end.getAddress());
            input = end;
            return IdentifierMatcher::categoriseIdentifier (currentStringValue);
        }

        if (input.isDigit())
            return parseNumericLiteral (false);

        auto currentChar = *input;

        if (currentChar == '-' && (input + 1).isDigit())
        {
            ++input;
            auto tok = parseNumericLiteral (true);

            if (tok == Token::literalInt32 || tok == Token::literalInt64)
                literalIntValue = -literalIntValue;
            else
                literalDoubleValue = -literalDoubleValue;

            return tok;
        }

        if (parseStringLiteral (currentChar))
            return Token::literalString;

        if (currentChar == '.' && parseFloatLiteral())
            return literalType;

        if (currentChar == '/' && ! shouldIgnoreComments)
        {
            auto c2 = *(input + 1);

            if (c2 == '/')
            {
                auto end = input.find ("\n");
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }

            if (c2 == '*')
            {
                location.location = input;
                auto end = (input + 2).find ("*/");
                if (end.isEmpty()) throwError (Errors::unterminatedComment());
                end += 2;
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }
        }

        if (auto op = OperatorList::match (input))
            return op;

        if (currentChar == '_' && IdentifierMatcher::isIdentifierBody (*(input + 1)))
            throwError (Errors::noLeadingUnderscoreAllowed());

        if (! input.isEmpty())
            throwError (Errors::illegalCharacter (std::string (input.getAddress(), (input + 1).getAddress())));

        return Token::eof;
    }